

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::gotSignal(UnixEventPort *this,siginfo_t *siginfo)

{
  PromiseFulfiller<siginfo_t> *pPVar1;
  ChildSet *this_00;
  anon_struct_128_5_975a5653_for_value local_b0;
  SignalPromiseAdapter *local_30;
  SignalPromiseAdapter *ptr;
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *cs;
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *_cs390;
  siginfo_t *siginfo_local;
  UnixEventPort *this_local;
  
  _cs390 = (Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)siginfo;
  siginfo_local = (siginfo_t *)this;
  cs = kj::_::readMaybe<kj::UnixEventPort::ChildSet,decltype(nullptr)>(&this->childSet);
  if (((SignalPromiseAdapter *)cs == (SignalPromiseAdapter *)0x0) ||
     (ptr = (SignalPromiseAdapter *)cs, *(int *)&_cs390->disposer != 0x11)) {
    local_30 = this->signalHead;
    while (local_30 != (SignalPromiseAdapter *)0x0) {
      if (local_30->signum == *(int *)&_cs390->disposer) {
        pPVar1 = local_30->fulfiller;
        cp<siginfo_t>(&local_b0,(anon_struct_128_5_975a5653_for_value *)_cs390);
        (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_b0);
        local_30 = SignalPromiseAdapter::removeFromList(local_30);
      }
      else {
        local_30 = local_30->next;
      }
    }
  }
  else {
    this_00 = Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>::operator->(cs);
    ChildSet::checkExits(this_00);
  }
  return;
}

Assistant:

void UnixEventPort::gotSignal(const siginfo_t& siginfo) {
  // If onChildExit() has been called and this is SIGCHLD, check for child exits.
  KJ_IF_SOME(cs, childSet) {
    if (siginfo.si_signo == SIGCHLD) {
      cs->checkExits();
      return;
    }
  }

  // Fire any events waiting on this signal.
  auto ptr = signalHead;
  while (ptr != nullptr) {
    if (ptr->signum == siginfo.si_signo) {
      ptr->fulfiller.fulfill(kj::cp(siginfo));
      ptr = ptr->removeFromList();
    } else {
      ptr = ptr->next;
    }
  }
}